

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2Impl::decomposeAndAppend
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool doDecompose,UnicodeString *safeMiddle
          ,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  bool bVar1;
  UChar *s;
  uint8_t uVar2;
  UBool UVar3;
  uint uVar4;
  int c_00;
  UChar *pUVar5;
  int local_6c;
  int local_5c;
  uint16_t __c2;
  int32_t __index;
  uint16_t norm16;
  UChar32 c;
  UChar *codePointStart;
  UChar *p;
  uint8_t cc;
  uint8_t prevCC;
  uint8_t firstCC;
  bool isFirst;
  ReorderingBuffer *buffer_local;
  UnicodeString *safeMiddle_local;
  UChar *pUStack_20;
  UBool doDecompose_local;
  UChar *limit_local;
  UChar *src_local;
  Normalizer2Impl *this_local;
  
  ReorderingBuffer::copyReorderableSuffixTo(buffer,safeMiddle);
  if (doDecompose == '\0') {
    bVar1 = true;
    p._6_1_ = '\0';
    p._5_1_ = '\0';
    codePointStart = src;
    while (s = codePointStart, codePointStart != limit) {
      pUVar5 = codePointStart + 1;
      uVar4 = (uint)(ushort)*codePointStart;
      if ((uVar4 & 0xfffff800) == 0xd800) {
        if ((((*codePointStart & 0x400U) == 0) && (pUVar5 != limit)) &&
           ((*pUVar5 & 0xfc00U) == 0xdc00)) {
          c_00 = uVar4 * 0x400 + (uint)(ushort)*pUVar5 + -0x35fdc00;
          if (c_00 < this->normTrie->highStart) {
            local_6c = ucptrie_internalSmallIndex_63(this->normTrie,c_00);
          }
          else {
            local_6c = this->normTrie->dataLength + -2;
          }
          local_5c = local_6c;
          codePointStart = codePointStart + 2;
        }
        else {
          local_5c = this->normTrie->dataLength + -1;
          codePointStart = pUVar5;
        }
      }
      else {
        local_5c = (uint)this->normTrie->index[(int)uVar4 >> 6] + (uVar4 & 0x3f);
        codePointStart = pUVar5;
      }
      uVar2 = getCC(this,*(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)local_5c * 2));
      if (uVar2 == '\0') break;
      p._5_1_ = uVar2;
      if (bVar1) {
        bVar1 = false;
        p._6_1_ = uVar2;
      }
    }
    pUStack_20 = limit;
    if (limit == (UChar *)0x0) {
      pUStack_20 = u_strchr_63(s,L'\0');
    }
    UVar3 = ReorderingBuffer::append
                      (buffer,src,(int32_t)((long)s - (long)src >> 1),'\0',p._6_1_,p._5_1_,errorCode
                      );
    if (UVar3 != '\0') {
      ReorderingBuffer::appendZeroCC(buffer,s,pUStack_20,errorCode);
    }
  }
  else {
    decompose(this,src,limit,buffer,errorCode);
  }
  return;
}

Assistant:

void Normalizer2Impl::decomposeAndAppend(const UChar *src, const UChar *limit,
                                         UBool doDecompose,
                                         UnicodeString &safeMiddle,
                                         ReorderingBuffer &buffer,
                                         UErrorCode &errorCode) const {
    buffer.copyReorderableSuffixTo(safeMiddle);
    if(doDecompose) {
        decompose(src, limit, &buffer, errorCode);
        return;
    }
    // Just merge the strings at the boundary.
    bool isFirst = true;
    uint8_t firstCC = 0, prevCC = 0, cc;
    const UChar *p = src;
    while (p != limit) {
        const UChar *codePointStart = p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        if ((cc = getCC(norm16)) == 0) {
            p = codePointStart;
            break;
        }
        if (isFirst) {
            firstCC = cc;
            isFirst = false;
        }
        prevCC = cc;
    }
    if(limit==NULL) {  // appendZeroCC() needs limit!=NULL
        limit=u_strchr(p, 0);
    }

    if (buffer.append(src, (int32_t)(p - src), FALSE, firstCC, prevCC, errorCode)) {
        buffer.appendZeroCC(p, limit, errorCode);
    }
}